

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureAsyncGeneratorNextFunction(JavascriptLibrary *this)

{
  JavascriptFunction **ppJVar1;
  RuntimeFunction *ptr;
  JavascriptLibrary *this_local;
  
  ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this->asyncGeneratorNextFunction);
  if (*ppJVar1 == (JavascriptFunction *)0x0) {
    ptr = DefaultCreateFunction
                    (this,(FunctionInfo *)JavascriptAsyncGenerator::EntryInfo::Next,1,
                     (DynamicObject *)0x0,(DynamicType *)0x0,0x107);
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
              (&this->asyncGeneratorNextFunction,&ptr->super_JavascriptFunction);
  }
  ppJVar1 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this->asyncGeneratorNextFunction);
  return *ppJVar1;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureAsyncGeneratorNextFunction()
    {
        if (asyncGeneratorNextFunction == nullptr)
        {
            asyncGeneratorNextFunction = DefaultCreateFunction(&JavascriptAsyncGenerator::EntryInfo::Next, 1, nullptr, nullptr, PropertyIds::next);
        }
        return asyncGeneratorNextFunction;
    }